

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_DrawSlabC(int dx,fixed_t v,int dy,fixed_t vi,BYTE *vptr,BYTE *p)

{
  BYTE BVar1;
  int iVar2;
  BYTE *pBVar3;
  BYTE color_3;
  BYTE color_2;
  BYTE color_1;
  BYTE color;
  int pitch;
  BYTE *colormap;
  BYTE *pBStack_28;
  int x;
  BYTE *p_local;
  BYTE *vptr_local;
  fixed_t vi_local;
  int dy_local;
  fixed_t v_local;
  int dx_local;
  
  pBVar3 = slabcolormap;
  iVar2 = dc_pitch;
  if (dx < 1) {
    __assert_fail("dx > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_draw.cpp"
                  ,0x5dd,"void R_DrawSlabC(int, fixed_t, int, fixed_t, const BYTE *, BYTE *)");
  }
  pBStack_28 = p;
  vptr_local._4_4_ = dy;
  vi_local = v;
  if (dx == 1) {
    for (; 0 < vptr_local._4_4_; vptr_local._4_4_ = vptr_local._4_4_ + -1) {
      *pBStack_28 = pBVar3[vptr[vi_local >> 0x10]];
      pBStack_28 = pBStack_28 + iVar2;
      vi_local = vi + vi_local;
    }
  }
  else if (dx == 2) {
    for (; 0 < vptr_local._4_4_; vptr_local._4_4_ = vptr_local._4_4_ + -1) {
      BVar1 = pBVar3[vptr[vi_local >> 0x10]];
      *pBStack_28 = BVar1;
      pBStack_28[1] = BVar1;
      pBStack_28 = pBStack_28 + iVar2;
      vi_local = vi + vi_local;
    }
  }
  else if (dx == 3) {
    for (; 0 < vptr_local._4_4_; vptr_local._4_4_ = vptr_local._4_4_ + -1) {
      BVar1 = pBVar3[vptr[vi_local >> 0x10]];
      *pBStack_28 = BVar1;
      pBStack_28[1] = BVar1;
      pBStack_28[2] = BVar1;
      pBStack_28 = pBStack_28 + iVar2;
      vi_local = vi + vi_local;
    }
  }
  else if (dx == 4) {
    for (; 0 < vptr_local._4_4_; vptr_local._4_4_ = vptr_local._4_4_ + -1) {
      BVar1 = pBVar3[vptr[vi_local >> 0x10]];
      *pBStack_28 = BVar1;
      pBStack_28[1] = BVar1;
      pBStack_28[2] = BVar1;
      pBStack_28[3] = BVar1;
      pBStack_28 = pBStack_28 + iVar2;
      vi_local = vi + vi_local;
    }
  }
  else {
    for (; 0 < vptr_local._4_4_; vptr_local._4_4_ = vptr_local._4_4_ + -1) {
      BVar1 = pBVar3[vptr[vi_local >> 0x10]];
      for (colormap._4_4_ = 0; colormap._4_4_ < dx; colormap._4_4_ = colormap._4_4_ + 1) {
        pBStack_28[colormap._4_4_] = BVar1;
      }
      pBStack_28 = pBStack_28 + iVar2;
      vi_local = vi + vi_local;
    }
  }
  return;
}

Assistant:

void R_DrawSlabC(int dx, fixed_t v, int dy, fixed_t vi, const BYTE *vptr, BYTE *p)
{
	int x;
	const BYTE *colormap = slabcolormap;
	int pitch = dc_pitch;

	assert(dx > 0);

	if (dx == 1)
	{
		while (dy > 0)
		{
			*p = colormap[vptr[v >> FRACBITS]];
			p += pitch;
			v += vi;
			dy--;
		}
	}
	else if (dx == 2)
	{
		while (dy > 0)
		{
			BYTE color = colormap[vptr[v >> FRACBITS]];
			p[0] = color;
			p[1] = color;
			p += pitch;
			v += vi;
			dy--;
		}
	}
	else if (dx == 3)
	{
		while (dy > 0)
		{
			BYTE color = colormap[vptr[v >> FRACBITS]];
			p[0] = color;
			p[1] = color;
			p[2] = color;
			p += pitch;
			v += vi;
			dy--;
		}
	}
	else if (dx == 4)
	{
		while (dy > 0)
		{
			BYTE color = colormap[vptr[v >> FRACBITS]];
			p[0] = color;
			p[1] = color;
			p[2] = color;
			p[3] = color;
			p += pitch;
			v += vi;
			dy--;
		}
	}
	else while (dy > 0)
	{
		BYTE color = colormap[vptr[v >> FRACBITS]];
		// The optimizer will probably turn this into a memset call.
		// Since dx is not likely to be large, I'm not sure that's a good thing,
		// hence the alternatives above.
		for (x = 0; x < dx; x++)
		{
			p[x] = color;
		}
		p += pitch;
		v += vi;
		dy--;
	}
}